

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O3

string * __thiscall
google::protobuf::internal::SubMessagePrefix
          (string *__return_storage_ptr__,internal *this,string *prefix,FieldDescriptor *field,
          int index)

{
  string *psVar1;
  int i;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,this,this + (long)&prefix->_M_dataplus);
  if (field[0x50] == (FieldDescriptor)0x1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,**(ulong **)(field + 8));
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,**(ulong **)field);
  }
  if (index != -1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    SimpleItoa_abi_cxx11_(&local_40,(protobuf *)(ulong)(uint)index,i);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  psVar1 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar1;
}

Assistant:

static string SubMessagePrefix(const string& prefix,
                               const FieldDescriptor* field,
                               int index) {
  string result(prefix);
  if (field->is_extension()) {
    result.append("(");
    result.append(field->full_name());
    result.append(")");
  } else {
    result.append(field->name());
  }
  if (index != -1) {
    result.append("[");
    result.append(SimpleItoa(index));
    result.append("]");
  }
  result.append(".");
  return result;
}